

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

sexp_uint_t integer_log2(sexp_uint_t x)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = x >> 0x20;
  if (uVar1 != 0) {
    x = uVar1;
  }
  if (x < 0x10000) {
    if (x < 0x100) {
      lVar2 = (long)""[x];
    }
    else {
      lVar2 = (long)""[x >> 8] + 8;
    }
  }
  else if (x < 0x1000000) {
    lVar2 = (long)""[x >> 0x10] + 0x10;
  }
  else {
    lVar2 = (long)""[x >> 0x18] + 0x18;
  }
  return (ulong)(uVar1 != 0) * 0x20 + lVar2;
}

Assistant:

static sexp_uint_t integer_log2 (sexp_uint_t x) {
  sexp_uint_t t, tt;
#if SEXP_64_BIT
  if ((tt = x >> 32))
    return integer_log2(tt) + 32;
  else
#endif
  if ((tt = x >> 16))
    return (t = tt >> 8) ? 24 + log_table_256[t] : 16 + log_table_256[tt];
  else 
    return (t = x >> 8) ? 8 + log_table_256[t] : log_table_256[x];
}